

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::CLASS_OP(SQVM *this,SQObjectPtr *target,SQInteger baseclass,SQInteger attributes)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectPtr *pSVar3;
  SQObjectPtr *pSVar4;
  SQSharedState *ss;
  SQTable *pSVar5;
  bool bVar6;
  SQClass *this_00;
  SQClass *pSVar7;
  SQChar *pSVar8;
  SQObjectPtr attrs;
  SQObjectPtr ret;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  local_50.super_SQObject._type = OT_NULL;
  local_50.super_SQObject._unVal.pTable = (SQTable *)0x0;
  if (baseclass == -1) {
    pSVar7 = (SQClass *)0x0;
  }
  else {
    pSVar3 = (this->_stack)._vals;
    pSVar4 = pSVar3 + this->_stackbase + baseclass;
    if (pSVar3[this->_stackbase + baseclass].super_SQObject._type != OT_CLASS) {
      pSVar8 = GetTypeName(pSVar4);
      bVar6 = false;
      Raise_Error(this,"trying to inherit from a %s",pSVar8);
      goto LAB_0012f0d6;
    }
    pSVar7 = (pSVar4->super_SQObject)._unVal.pClass;
  }
  if (attributes != 0xff) {
    pSVar4 = (this->_stack)._vals;
    local_50.super_SQObject._unVal =
         (SQObjectValue)pSVar4[this->_stackbase + attributes].super_SQObject._unVal.pTable;
    local_50.super_SQObject._type = pSVar4[this->_stackbase + attributes].super_SQObject._type;
    if ((local_50.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
  }
  ss = this->_sharedstate;
  this_00 = (SQClass *)sq_vm_malloc(0x1c8);
  SQClass::SQClass(this_00,ss,pSVar7);
  pSVar5 = (target->super_SQObject)._unVal.pTable;
  SVar2 = (target->super_SQObject)._type;
  (target->super_SQObject)._type = OT_CLASS;
  (target->super_SQObject)._unVal.pClass = this_00;
  pSVar1 = &(this_00->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = (target->super_SQObject)._unVal.pClass;
  if (pSVar7->_metamethods[0x11].super_SQObject._type != OT_NULL) {
    local_40.super_SQObject._type = OT_NULL;
    local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
    Push(this,target);
    Push(this,&local_50);
    bVar6 = Call(this,((target->super_SQObject)._unVal.pClass)->_metamethods + 0x11,2,
                 this->_top + -2,&local_40,0);
    Pop(this,2);
    SQObjectPtr::~SQObjectPtr(&local_40);
    if (!bVar6) {
      bVar6 = false;
      goto LAB_0012f0d6;
    }
    pSVar7 = (target->super_SQObject)._unVal.pClass;
  }
  SVar2 = (pSVar7->_attributes).super_SQObject._type;
  pSVar5 = (pSVar7->_attributes).super_SQObject._unVal.pTable;
  (pSVar7->_attributes).super_SQObject._unVal.pTable = (SQTable *)local_50.super_SQObject._unVal;
  (pSVar7->_attributes).super_SQObject._type = local_50.super_SQObject._type;
  if ((local_50.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  bVar6 = true;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
LAB_0012f0d6:
  SQObjectPtr::~SQObjectPtr(&local_50);
  return bVar6;
}

Assistant:

bool SQVM::CLASS_OP(SQObjectPtr &target,SQInteger baseclass,SQInteger attributes)
{
    SQClass *base = NULL;
    SQObjectPtr attrs;
    if(baseclass != -1) {
        if(type(_stack._vals[_stackbase+baseclass]) != OT_CLASS) { Raise_Error(_SC("trying to inherit from a %s"),GetTypeName(_stack._vals[_stackbase+baseclass])); return false; }
        base = _class(_stack._vals[_stackbase + baseclass]);
    }
    if(attributes != MAX_FUNC_STACKSIZE) {
        attrs = _stack._vals[_stackbase+attributes];
    }
    target = SQClass::Create(_ss(this),base);
    if(type(_class(target)->_metamethods[MT_INHERITED]) != OT_NULL) {
        int nparams = 2;
        SQObjectPtr ret;
        Push(target); Push(attrs);
        if(!Call(_class(target)->_metamethods[MT_INHERITED],nparams,_top - nparams, ret, false)) {
            Pop(nparams);
            return false;
        }
        Pop(nparams);
    }
    _class(target)->_attributes = attrs;
    return true;
}